

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O2

string * __thiscall
re2c::InputAPI::stmt_skip_backup_peek_abi_cxx11_
          (string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  opt_t *poVar1;
  string *this_00;
  string sStack_138;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->type_ == DEFAULT) {
    indent_abi_cxx11_(&local_98,(re2c *)(ulong)ind,ind);
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    std::operator+(&local_78,&local_98,&poVar1->yych);
    std::operator+(&local_58,&local_78," = ");
    Opt::yychConversion_abi_cxx11_(&local_b8,(Opt *)&opts);
    std::operator+(&local_38,&local_58,&local_b8);
    std::operator+(&sStack_138,&local_38,"*(");
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    std::operator+(&local_118,&sStack_138,&poVar1->yymarker);
    std::operator+(&local_f8,&local_118," = ++");
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    std::operator+(&local_d8,&local_f8,&poVar1->yycursor);
    std::operator+(__return_storage_ptr__,&local_d8,");\n");
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&sStack_138);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    this_00 = &local_98;
  }
  else {
    stmt_skip_abi_cxx11_(&local_f8,this,ind);
    stmt_backup_abi_cxx11_(&local_118,this,ind);
    std::operator+(&local_d8,&local_f8,&local_118);
    stmt_peek_abi_cxx11_(&sStack_138,this,ind);
    std::operator+(__return_storage_ptr__,&local_d8,&sStack_138);
    std::__cxx11::string::~string((string *)&sStack_138);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_118);
    this_00 = &local_f8;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_skip_backup_peek (uint32_t ind) const
{
	return type_ == DEFAULT
		? indent (ind) + opts->yych + " = " + opts.yychConversion () + "*(" + opts->yymarker + " = ++" + opts->yycursor + ");\n"
		: stmt_skip (ind) + stmt_backup (ind) + stmt_peek (ind);
}